

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilter.cpp
# Opt level: O0

void __thiscall
UnscentedKalmanFilter::UnscentedKalmanFilter(UnscentedKalmanFilter *this,UKFParameters *p)

{
  double dVar1;
  int iVar2;
  int iVar3;
  Scalar *pSVar4;
  ostream *poVar5;
  double dVar6;
  Nested local_b8;
  Nested local_b0;
  int local_a4;
  undefined1 local_a0 [4];
  int i_1;
  Matrix<double,__1,_1,_0,__1,_1> local_90;
  int local_7c;
  undefined1 local_78 [4];
  int i;
  Matrix<double,__1,__1,_0,__1,__1> local_68;
  Matrix<double,__1,__1,_0,__1,__1> local_50;
  Matrix<double,__1,_1,_0,__1,_1> local_38 [2];
  UKFParameters *local_18;
  UKFParameters *p_local;
  UnscentedKalmanFilter *this_local;
  
  this->_vptr_UnscentedKalmanFilter = (_func_int **)&PTR__UnscentedKalmanFilter_002d4d08;
  this->std_a_ = p->std_a;
  this->std_yawdd_ = p->std_yawdd;
  this->pred_rate_ = p->pred_rate;
  this->debug_ = p->debug;
  this->type_ = p->type;
  this->k_ = p->k;
  this->alpha_ = p->alpha;
  this->beta_ = p->beta;
  this->n_x_ = 5;
  this->n_aug_ = this->n_x_ + 2;
  this->n_sigma_ = this->n_aug_ * 2 + 1;
  this->restart_ = false;
  this->is_initialized_ = false;
  this->previous_measurement_ = (Measurement *)0x0;
  this->current_sensor_ = (Sensor *)0x0;
  local_18 = p;
  p_local = (UKFParameters *)this;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->weights_m_);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->weights_c_);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->x_);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->P_);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->Xsig_pred_);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(local_38,(long)this->n_x_);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=(&this->x_,local_38);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(local_38);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_50,&this->n_x_,&this->n_x_);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(&this->P_,&local_50);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_50);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_68,&this->n_x_,&this->n_sigma_);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(&this->Xsig_pred_,&local_68);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_68);
  if (this->type_ == UKFScaled) {
    this->lambda_ =
         this->alpha_ * this->alpha_ * (double)(this->n_aug_ + this->k_) - (double)this->n_aug_;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&local_90,(long)this->n_sigma_);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=(&this->weights_m_,&local_90);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_90);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
              ((Matrix<double,__1,_1,_0,__1,_1> *)local_a0,(long)this->n_sigma_);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
              (&this->weights_c_,(Matrix<double,__1,_1,_0,__1,_1> *)local_a0);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_a0);
    dVar6 = this->lambda_;
    iVar2 = this->n_aug_;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        &this->weights_m_,0);
    *pSVar4 = dVar6 / (dVar6 + (double)iVar2);
    dVar6 = this->alpha_;
    dVar1 = this->lambda_;
    iVar2 = this->n_aug_;
    iVar3 = this->beta_;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        &this->weights_c_,0);
    *pSVar4 = dVar1 / (dVar1 + (double)iVar2) + (1.0 - dVar6 * dVar6) + (double)iVar3;
    for (local_a4 = 1; local_a4 < this->n_sigma_; local_a4 = local_a4 + 1) {
      dVar6 = 0.5 / ((double)this->n_aug_ + this->lambda_);
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          &this->weights_c_,(long)local_a4);
      *pSVar4 = dVar6;
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          &this->weights_m_,(long)local_a4);
      *pSVar4 = dVar6;
    }
  }
  else {
    this->lambda_ = (double)(this->k_ - this->n_aug_);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
              ((Matrix<double,__1,_1,_0,__1,_1> *)local_78,(long)this->n_sigma_);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
              (&this->weights_m_,(Matrix<double,__1,_1,_0,__1,_1> *)local_78);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_78);
    dVar6 = this->lambda_;
    iVar2 = this->n_aug_;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        &this->weights_m_,0);
    *pSVar4 = dVar6 / (dVar6 + (double)iVar2);
    for (local_7c = 1; local_7c < this->n_sigma_; local_7c = local_7c + 1) {
      iVar2 = this->n_aug_;
      dVar6 = this->lambda_;
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          &this->weights_m_,(long)local_7c);
      *pSVar4 = 0.5 / ((double)iVar2 + dVar6);
    }
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=(&this->weights_c_,&this->weights_m_);
  }
  if (0 < this->debug_) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Weights m:\n");
    local_b0 = (Nested)Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose
                                 ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                  &this->weights_m_);
    poVar5 = Eigen::operator<<(poVar5,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                       *)&local_b0);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)&std::cout,"Weights c:\n");
    local_b8 = (Nested)Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose
                                 ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                  &this->weights_c_);
    poVar5 = Eigen::operator<<(poVar5,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                       *)&local_b8);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

UnscentedKalmanFilter::UnscentedKalmanFilter(const UnscentedKalmanFilter::UKFParameters &p) :
    std_a_(p.std_a),
    std_yawdd_(p.std_yawdd),
    debug_(p.debug),
    pred_rate_(p.pred_rate),
    type_(p.type),
    k_(p.k),
    alpha_(p.alpha),
    beta_(p.beta),

    n_x_(5),
    n_aug_(n_x_+2),
    n_sigma_(2*n_aug_+1),

    restart_(false),
    is_initialized_(false),

    previous_measurement_(0),
    current_sensor_(0)
{
  // initial state vector
  x_ = VectorXd(n_x_);

  // initial covariance matrix
  P_ = MatrixXd(n_x_, n_x_);

  Xsig_pred_ = MatrixXd(n_x_, n_sigma_); 

  if (type_ != UKFScaled) {
  
      // set weights for classic style of UKF

      lambda_ = k_ - n_aug_;

      weights_m_ = VectorXd(n_sigma_);
      
      weights_m_(0)= lambda_ / (lambda_+n_aug_);
      
      for (int i=1; i<n_sigma_; i++) {  //2n+1 weights
          weights_m_(i) = .5/(n_aug_+lambda_);
      }

      weights_c_ = weights_m_;

  } else {

      // set weights for scaled type of UKF

      lambda_ = alpha_*alpha_*(n_aug_+k_) - n_aug_;
  
      weights_m_ = VectorXd(n_sigma_);
      weights_c_ = VectorXd(n_sigma_);

      weights_m_(0) = lambda_/(lambda_+n_aug_);
      weights_c_(0) = lambda_/(lambda_+n_aug_) + (1-alpha_*alpha_ + beta_);

      for (int i=1; i<n_sigma_; i++) {  // 2n+1 weights
          weights_m_(i) = weights_c_(i) = .5/(n_aug_+lambda_);
      }
  }

  if (debug_ > 0) { 
      std::cout << "Weights m:\n" << weights_m_.transpose() << std::endl;
      std::cout << "Weights c:\n" << weights_c_.transpose() << std::endl;
  }
}